

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  Arena *this_00;
  value_type *pvVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  uint32 uVar6;
  int32 iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *this_01;
  undefined4 extraout_var_01;
  FieldDescriptor *this_02;
  RepeatedPtrFieldBase *this_03;
  LogMessage *other;
  uint64 uVar10;
  string *psVar11;
  int64 iVar12;
  Message *pMVar13;
  long *plVar14;
  MapValueRef *this_04;
  LogFinisher local_81;
  const_iterator it;
  LogMessage local_68;
  long *plVar9;
  
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar9 = (long *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  std::__cxx11::string::string((string *)&local_68,"key",(allocator *)&it);
  this_01 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar4),(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  std::__cxx11::string::string((string *)&local_68,"value",(allocator *)&it);
  this_02 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_01,iVar4),(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this_03 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_03 == (RepeatedPtrFieldBase *)0x0) {
    this_00 = (this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.arena_;
    if (this_00 == (Arena *)0x0) {
      this_03 = (RepeatedPtrFieldBase *)operator_new(0x18);
      ((RepeatedPtrFieldBase *)&this_03->arena_)->arena_ = (Arena *)0x0;
      this_03->current_size_ = 0;
      this_03->total_size_ = 0;
      this_03->rep_ = (Rep *)0x0;
    }
    else {
      this_03 = (RepeatedPtrFieldBase *)
                Arena::AllocateAligned
                          (this_00,(type_info *)
                                   &RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18);
      ((RepeatedPtrFieldBase *)&this_03->arena_)->arena_ = this_00;
      this_03->current_size_ = 0;
      this_03->total_size_ = 0;
      this_03->rep_ = (Rep *)0x0;
      Arena::AddListNode(this_00,this_03,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                        );
    }
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)this_03;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this_03);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(&it,&this->map_);
  while (it.it_.node_ != (Node *)0x0) {
    iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])();
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,iVar4);
    pvVar1 = ((it.it_.node_)->kv).v_;
    CVar5 = FieldDescriptor::cpp_type(this_01);
    switch(CVar5) {
    case CPPTYPE_INT32:
      iVar7 = MapKey::GetInt32Value(&pvVar1->first);
      (**(code **)(*plVar9 + 0xe8))(plVar9,iVar4,this_01,iVar7);
      break;
    case CPPTYPE_INT64:
      iVar12 = MapKey::GetInt64Value(&pvVar1->first);
      (**(code **)(*plVar9 + 0xf0))(plVar9,iVar4,this_01,iVar12);
      break;
    case CPPTYPE_UINT32:
      uVar6 = MapKey::GetUInt32Value(&pvVar1->first);
      (**(code **)(*plVar9 + 0xf8))(plVar9,iVar4,this_01,uVar6);
      break;
    case CPPTYPE_UINT64:
      uVar10 = MapKey::GetUInt64Value(&pvVar1->first);
      (**(code **)(*plVar9 + 0x100))(plVar9,iVar4,this_01,uVar10);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x11c);
      other = LogMessage::operator<<(&local_68,"Can\'t get here.");
      LogFinisher::operator=(&local_81,other);
      LogMessage::~LogMessage(&local_68);
      break;
    case CPPTYPE_BOOL:
      bVar3 = MapKey::GetBoolValue(&pvVar1->first);
      (**(code **)(*plVar9 + 0x118))(plVar9,iVar4,this_01,bVar3);
      break;
    case CPPTYPE_STRING:
      psVar11 = MapKey::GetStringValue_abi_cxx11_(&pvVar1->first);
      (**(code **)(*plVar9 + 0x120))(plVar9,iVar4,this_01,psVar11);
    }
    pvVar1 = ((it.it_.node_)->kv).v_;
    CVar5 = FieldDescriptor::cpp_type(this_02);
    if (CVar5 - CPPTYPE_INT32 < 10) {
      this_04 = &pvVar1->second;
      switch(CVar5) {
      case CPPTYPE_INT32:
        iVar7 = MapValueRef::GetInt32Value(this_04);
        (**(code **)(*plVar9 + 0xe8))(plVar9,iVar4,this_02,iVar7);
        break;
      case CPPTYPE_INT64:
        iVar12 = MapValueRef::GetInt64Value(this_04);
        (**(code **)(*plVar9 + 0xf0))(plVar9,iVar4,this_02,iVar12);
        break;
      case CPPTYPE_UINT32:
        uVar6 = MapValueRef::GetUInt32Value(this_04);
        (**(code **)(*plVar9 + 0xf8))(plVar9,iVar4,this_02,uVar6);
        break;
      case CPPTYPE_UINT64:
        uVar10 = MapValueRef::GetUInt64Value(this_04);
        (**(code **)(*plVar9 + 0x100))(plVar9,iVar4,this_02,uVar10);
        break;
      case CPPTYPE_DOUBLE:
        dVar2 = MapValueRef::GetDoubleValue(this_04);
        (**(code **)(*plVar9 + 0x110))(SUB84(dVar2,0),plVar9,iVar4,this_02);
        break;
      case CPPTYPE_FLOAT:
        MapValueRef::GetFloatValue(this_04);
        (**(code **)(*plVar9 + 0x108))(plVar9,iVar4,this_02);
        break;
      case CPPTYPE_BOOL:
        bVar3 = MapValueRef::GetBoolValue(this_04);
        (**(code **)(*plVar9 + 0x118))(plVar9,iVar4,this_02,bVar3);
        break;
      case CPPTYPE_ENUM:
        iVar8 = MapValueRef::GetEnumValue(this_04);
        (**(code **)(*plVar9 + 0x130))(plVar9,iVar4,this_02,iVar8);
        break;
      case CPPTYPE_STRING:
        psVar11 = MapValueRef::GetStringValue_abi_cxx11_(this_04);
        (**(code **)(*plVar9 + 0x120))(plVar9,iVar4,this_02,psVar11);
        break;
      case CPPTYPE_MESSAGE:
        pMVar13 = MapValueRef::GetMessageValue(this_04);
        plVar14 = (long *)(**(code **)(*plVar9 + 0x138))(plVar9,iVar4,this_02,0);
        (**(code **)(*plVar14 + 0x88))(plVar14,pMVar13);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&it.it_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}